

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O2

Node * __thiscall
TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_>::GetNode
          (TMap<int,_FUDMFKeys,_THashTraits<int>,_TValueTraits<FUDMFKeys>_> *this,int key)

{
  Node *pNVar1;
  
  pNVar1 = FindKey(this,key);
  if (pNVar1 == (Node *)0x0) {
    pNVar1 = NewKey(this,key);
    (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Array = (FUDMFKey *)0x0;
    (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Most = 0;
    (pNVar1->Pair).Value.super_TArray<FUDMFKey,_FUDMFKey>.Count = 0;
  }
  return pNVar1;
}

Assistant:

Node *GetNode(const KT key)
	{
		Node *n = FindKey(key);
		if (n != NULL)
		{
			return n;
		}
		n = NewKey(key);
		ValueTraits traits;
		traits.Init(n->Pair.Value);
		return n;
	}